

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O3

void __thiscall
ut::registry::add_test<agge::WorkerTests>
          (registry *this,offset_in_WorkerTests_to_subr method,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  registry *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  void *__dest;
  int *piVar5;
  undefined8 *puVar6;
  char *in_RCX;
  size_type *psVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [32];
  char *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  registry *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  int *local_58;
  _Base_ptr local_50 [4];
  
  get_setup<agge::WorkerTests>((registry *)local_a8);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_c8,in_RCX,(allocator *)local_50);
  uVar3 = local_a8._8_8_;
  uVar2 = local_a8._0_8_;
  local_78 = (_Base_ptr)local_a8._0_8_;
  p_Stack_70 = (_Base_ptr)local_a8._8_8_;
  if ((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) {
    *(int *)(test_case **)local_a8._8_8_ = *(int *)(test_case **)local_a8._8_8_ + 1;
  }
  paVar4->_M_allocated_capacity = (size_type)&PTR__test_case_impl_0010ad18;
  (&paVar4->_M_allocated_capacity)[1] = method;
  (&paVar4->_M_allocated_capacity)[2] = (size_type)name;
  local_68 = this;
  __dest = operator_new__(local_c8._M_string_length + 1);
  (&paVar4->_M_allocated_capacity)[3] = (size_type)__dest;
  if (local_c8._M_string_length != 0) {
    memmove(__dest,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  *(undefined1 *)((long)__dest + local_c8._M_string_length) = 0;
  (&paVar4->_M_allocated_capacity)[4] =
       (size_type)exportable::immutable_basic_string<char>::deallocate;
  (&paVar4->_M_allocated_capacity)[5] = uVar2;
  (&paVar4->_M_allocated_capacity)[6] = uVar3;
  if ((_Base_ptr)uVar3 != (_Base_ptr)0x0) {
    *(int *)(test_case **)uVar3 = *(int *)(test_case **)uVar3 + 1;
  }
  local_60 = paVar4;
  piVar5 = (int *)operator_new(4);
  this_00 = local_68;
  *piVar5 = 1;
  local_58 = piVar5;
  if (((_Base_ptr)uVar3 != (_Base_ptr)0x0) &&
     (*(int *)(test_case **)uVar3 = *(int *)(test_case **)uVar3 + -1,
     *(int *)(test_case **)uVar3 == 0)) {
    if ((_Base_ptr)uVar2 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
    }
    operator_delete((void *)uVar3);
  }
  local_78 = (_Base_ptr)0x0;
  p_Stack_70 = (_Base_ptr)0x0;
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  (**(code **)(paVar4->_M_allocated_capacity + 0x10))(&local_88,paVar4);
  std::__cxx11::string::string((string *)local_50,local_88,&local_c9);
  (**(code **)(paVar4->_M_allocated_capacity + 0x18))(local_a8 + 0x10,paVar4);
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c8.field_2._M_allocated_capacity = *psVar7;
    local_c8.field_2._8_8_ = puVar6[3];
    local_c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar7;
    local_c8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_c8._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this_00->_registered_names,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  (*(code *)local_a8._24_8_)(local_a8._16_8_);
  if (local_50[0] != (_Base_ptr)(local_50 + 2)) {
    operator_delete(local_50[0]);
  }
  (*(code *)local_80)(local_88);
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *piVar5 = *piVar5 + 1;
    local_c8._M_dataplus._M_p = (pointer)paVar4;
    local_c8._M_string_length = (size_type)piVar5;
    std::
    vector<ut::shared_ptr<ut::test_case,unsigned_int>,std::allocator<ut::shared_ptr<ut::test_case,unsigned_int>>>
    ::emplace_back<ut::shared_ptr<ut::test_case,unsigned_int>>
              ((vector<ut::shared_ptr<ut::test_case,unsigned_int>,std::allocator<ut::shared_ptr<ut::test_case,unsigned_int>>>
                *)this_00,(shared_ptr<ut::test_case,_unsigned_int> *)&local_c8);
    if (((int *)local_c8._M_string_length != (int *)0x0) &&
       (*(int *)local_c8._M_string_length = *(int *)local_c8._M_string_length + -1,
       *(int *)local_c8._M_string_length == 0)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))(local_c8._M_dataplus._M_p);
      }
      operator_delete((void *)local_c8._M_string_length);
    }
  }
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    (**(code **)(paVar4->_M_allocated_capacity + 8))(paVar4);
    operator_delete(piVar5);
  }
  if (((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) &&
     (*(int *)(test_case **)local_a8._8_8_ = *(int *)(test_case **)local_a8._8_8_ + -1,
     *(int *)(test_case **)local_a8._8_8_ == 0)) {
    if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))(local_a8._0_8_);
    }
    operator_delete((void *)local_a8._8_8_);
  }
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}